

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteMessage.cpp
# Opt level: O3

void __thiscall DeleteMessage::DeleteMessage(DeleteMessage *this,char *directory)

{
  ServerOperation::ServerOperation(&this->super_ServerOperation,directory);
  (this->super_ServerOperation)._vptr_ServerOperation = (_func_int **)&PTR_fillMe_00109ce8;
  (this->username)._M_dataplus._M_p = (pointer)&(this->username).field_2;
  (this->username)._M_string_length = 0;
  (this->username).field_2._M_local_buf[0] = '\0';
  this->parameter_count = 0;
  this->chosen_message = 0;
  std::__cxx11::string::_M_replace((ulong)&this->username,0,(char *)0x0,0x107467);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ServerOperation).statusMessage,0,
             (char *)(this->super_ServerOperation).statusMessage._M_string_length,0x1071c7);
  return;
}

Assistant:

DeleteMessage::DeleteMessage(const char * directory) : ServerOperation(directory) {
    parameter_count = 0;
    chosen_message = 0;
    username = "";
    statusMessage = "User:";
}